

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O2

uint CalculateNextWorkRequired(CBlockIndex *pindexLast,int64_t nFirstBlockTime,Params *params)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  base_uint<256U> local_80;
  arith_uint256 bnNew;
  arith_uint256 bnPowLimit;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (params->fPowNoRetargeting == true) {
    uVar3 = pindexLast->nBits;
  }
  else {
    lVar5 = (ulong)pindexLast->nTime - nFirstBlockTime;
    lVar4 = params->nPowTargetTimespan / 4;
    if (lVar5 <= lVar4) {
      lVar5 = lVar4;
    }
    lVar4 = params->nPowTargetTimespan * 4;
    if (lVar5 < lVar4) {
      lVar4 = lVar5;
    }
    UintToArith256(&bnPowLimit,&params->powLimit);
    base_uint<256U>::base_uint(&bnNew.super_base_uint<256U>);
    if (params->enforce_BIP94 == true) {
      pindexLast = CBlockIndex::GetAncestor
                             (pindexLast,
                              (pindexLast->nHeight -
                              (int)(params->nPowTargetTimespan / params->nPowTargetSpacing)) + 1);
    }
    arith_uint256::SetCompact
              ((arith_uint256 *)&bnNew.super_base_uint<256U>,pindexLast->nBits,(bool *)0x0,
               (bool *)0x0);
    base_uint<256U>::operator*=(&bnNew.super_base_uint<256U>,(uint32_t)lVar4);
    base_uint<256U>::base_uint(&local_80,params->nPowTargetTimespan);
    base_uint<256U>::operator/=(&bnNew.super_base_uint<256U>,&local_80);
    bVar2 = operator>(&bnNew.super_base_uint<256U>,&bnPowLimit.super_base_uint<256U>);
    if (bVar2) {
      base_uint<256U>::operator=(&bnNew.super_base_uint<256U>,&bnPowLimit.super_base_uint<256U>);
    }
    uVar3 = arith_uint256::GetCompact(&bnNew,false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CalculateNextWorkRequired(const CBlockIndex* pindexLast, int64_t nFirstBlockTime, const Consensus::Params& params)
{
    if (params.fPowNoRetargeting)
        return pindexLast->nBits;

    // Limit adjustment step
    int64_t nActualTimespan = pindexLast->GetBlockTime() - nFirstBlockTime;
    if (nActualTimespan < params.nPowTargetTimespan/4)
        nActualTimespan = params.nPowTargetTimespan/4;
    if (nActualTimespan > params.nPowTargetTimespan*4)
        nActualTimespan = params.nPowTargetTimespan*4;

    // Retarget
    const arith_uint256 bnPowLimit = UintToArith256(params.powLimit);
    arith_uint256 bnNew;

    // Special difficulty rule for Testnet4
    if (params.enforce_BIP94) {
        // Here we use the first block of the difficulty period. This way
        // the real difficulty is always preserved in the first block as
        // it is not allowed to use the min-difficulty exception.
        int nHeightFirst = pindexLast->nHeight - (params.DifficultyAdjustmentInterval()-1);
        const CBlockIndex* pindexFirst = pindexLast->GetAncestor(nHeightFirst);
        bnNew.SetCompact(pindexFirst->nBits);
    } else {
        bnNew.SetCompact(pindexLast->nBits);
    }

    bnNew *= nActualTimespan;
    bnNew /= params.nPowTargetTimespan;

    if (bnNew > bnPowLimit)
        bnNew = bnPowLimit;

    return bnNew.GetCompact();
}